

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavMoveRequestTryWrapping(ImGuiWindow *window,ImGuiNavMoveFlags move_flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  uint in_ESI;
  ImGuiWindow *in_RDI;
  float fVar3;
  float fVar4;
  ImGuiDir clip_dir;
  ImRect bb_rel;
  ImGuiContext *g;
  ImGuiDir move_flags_00;
  ImVec2 IVar5;
  ImVec2 bb_rel_00;
  float clip_dir_00;
  ImVec2 IVar6;
  
  pIVar1 = GImGui;
  if ((((GImGui->NavWindow == in_RDI) && (bVar2 = NavMoveRequestButNoResultYet(), bVar2)) &&
      (pIVar1->NavMoveRequestForward == ImGuiNavForward_None)) &&
     (pIVar1->NavLayer == ImGuiNavLayer_Main)) {
    IVar5 = in_RDI->NavRectRel[0].Min;
    IVar6 = in_RDI->NavRectRel[0].Max;
    move_flags_00 = pIVar1->NavMoveDir;
    if ((pIVar1->NavMoveDir == 0) && ((in_ESI & 5) != 0)) {
      fVar3 = ImMax<float>((in_RDI->SizeFull).x,(in_RDI->SizeContents).x);
      fVar3 = fVar3 - (in_RDI->Scroll).x;
      IVar6.x = fVar3;
      IVar5.x = fVar3;
      if ((in_ESI & 4) != 0) {
        fVar3 = ImRect::GetHeight((ImRect *)&stack0xffffffffffffffd8);
        ImRect::TranslateY((ImRect *)&stack0xffffffffffffffd8,-fVar3);
        move_flags_00 = 2;
      }
      NavMoveRequestForward((ImGuiDir)IVar6.y,(ImGuiDir)IVar6.x,(ImRect *)IVar5,move_flags_00);
    }
    if ((pIVar1->NavMoveDir == 1) && ((in_ESI & 5) != 0)) {
      fVar3 = (in_RDI->Scroll).x;
      IVar6 = (ImVec2)(CONCAT44(IVar6.y,fVar3) ^ 0x80000000);
      IVar5 = (ImVec2)(CONCAT44(IVar5.y,fVar3) ^ 0x80000000);
      if ((in_ESI & 4) != 0) {
        fVar3 = ImRect::GetHeight((ImRect *)&stack0xffffffffffffffd8);
        ImRect::TranslateY((ImRect *)&stack0xffffffffffffffd8,fVar3);
        move_flags_00 = 3;
      }
      NavMoveRequestForward((ImGuiDir)IVar6.y,(ImGuiDir)IVar6.x,(ImRect *)IVar5,move_flags_00);
    }
    fVar3 = IVar5.x;
    clip_dir_00 = IVar6.x;
    if ((pIVar1->NavMoveDir == 2) && ((in_ESI & 10) != 0)) {
      fVar4 = ImMax<float>((in_RDI->SizeFull).y,(in_RDI->SizeContents).y);
      fVar4 = fVar4 - (in_RDI->Scroll).y;
      bb_rel_00.y = fVar4;
      bb_rel_00.x = fVar3;
      if ((in_ESI & 8) != 0) {
        fVar3 = ImRect::GetWidth((ImRect *)&stack0xffffffffffffffd8);
        ImRect::TranslateX((ImRect *)&stack0xffffffffffffffd8,-fVar3);
        move_flags_00 = 0;
      }
      NavMoveRequestForward((ImGuiDir)fVar4,(ImGuiDir)clip_dir_00,(ImRect *)bb_rel_00,move_flags_00)
      ;
      fVar3 = bb_rel_00.x;
    }
    if ((pIVar1->NavMoveDir == 3) && ((in_ESI & 10) != 0)) {
      fVar4 = (in_RDI->Scroll).y;
      IVar6 = (ImVec2)(CONCAT44(fVar4,clip_dir_00) ^ 0x8000000000000000);
      IVar5 = (ImVec2)(CONCAT44(fVar4,fVar3) ^ 0x8000000000000000);
      if ((in_ESI & 8) != 0) {
        fVar3 = ImRect::GetWidth((ImRect *)&stack0xffffffffffffffd8);
        ImRect::TranslateX((ImRect *)&stack0xffffffffffffffd8,fVar3);
        move_flags_00 = 1;
      }
      NavMoveRequestForward((ImGuiDir)IVar6.y,(ImGuiDir)IVar6.x,(ImRect *)IVar5,move_flags_00);
    }
  }
  return;
}

Assistant:

void ImGui::NavMoveRequestTryWrapping(ImGuiWindow* window, ImGuiNavMoveFlags move_flags)
{
    ImGuiContext& g = *GImGui;
    if (g.NavWindow != window || !NavMoveRequestButNoResultYet() || g.NavMoveRequestForward != ImGuiNavForward_None || g.NavLayer != 0)
        return;
    IM_ASSERT(move_flags != 0); // No points calling this with no wrapping
    ImRect bb_rel = window->NavRectRel[0];

    ImGuiDir clip_dir = g.NavMoveDir;
    if (g.NavMoveDir == ImGuiDir_Left && (move_flags & (ImGuiNavMoveFlags_WrapX | ImGuiNavMoveFlags_LoopX)))
    {
        bb_rel.Min.x = bb_rel.Max.x = ImMax(window->SizeFull.x, window->SizeContents.x) - window->Scroll.x;
        if (move_flags & ImGuiNavMoveFlags_WrapX) { bb_rel.TranslateY(-bb_rel.GetHeight()); clip_dir = ImGuiDir_Up; }
        NavMoveRequestForward(g.NavMoveDir, clip_dir, bb_rel, move_flags);
    }
    if (g.NavMoveDir == ImGuiDir_Right && (move_flags & (ImGuiNavMoveFlags_WrapX | ImGuiNavMoveFlags_LoopX)))
    {
        bb_rel.Min.x = bb_rel.Max.x = -window->Scroll.x;
        if (move_flags & ImGuiNavMoveFlags_WrapX) { bb_rel.TranslateY(+bb_rel.GetHeight()); clip_dir = ImGuiDir_Down; }
        NavMoveRequestForward(g.NavMoveDir, clip_dir, bb_rel, move_flags);
    }
    if (g.NavMoveDir == ImGuiDir_Up && (move_flags & (ImGuiNavMoveFlags_WrapY | ImGuiNavMoveFlags_LoopY)))
    {
        bb_rel.Min.y = bb_rel.Max.y = ImMax(window->SizeFull.y, window->SizeContents.y) - window->Scroll.y;
        if (move_flags & ImGuiNavMoveFlags_WrapY) { bb_rel.TranslateX(-bb_rel.GetWidth()); clip_dir = ImGuiDir_Left; }
        NavMoveRequestForward(g.NavMoveDir, clip_dir, bb_rel, move_flags);
    }
    if (g.NavMoveDir == ImGuiDir_Down && (move_flags & (ImGuiNavMoveFlags_WrapY | ImGuiNavMoveFlags_LoopY)))
    {
        bb_rel.Min.y = bb_rel.Max.y = -window->Scroll.y;
        if (move_flags & ImGuiNavMoveFlags_WrapY) { bb_rel.TranslateX(+bb_rel.GetWidth()); clip_dir = ImGuiDir_Right; }
        NavMoveRequestForward(g.NavMoveDir, clip_dir, bb_rel, move_flags);
    }
}